

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

optional<unsigned_long> __thiscall
tsbp::LeftmostActiveOnly::Branch(LeftmostActiveOnly *this,size_t nodeId)

{
  StoredVertexList *this_00;
  ulong *puVar1;
  int iVar2;
  long lVar3;
  pointer pRVar4;
  pointer pRVar5;
  __uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> _Var6;
  pointer psVar7;
  iterator iVar8;
  bool bVar9;
  size_type sVar10;
  Packing2D *pPVar11;
  pointer psVar12;
  void *pvVar13;
  ulong uVar14;
  pointer psVar15;
  int *piVar16;
  _Storage<unsigned_long,_true> _Var17;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  _Storage<unsigned_long,_true> _Var18;
  _Storage<unsigned_long,_true> _Var19;
  _Storage<unsigned_long,_true> unaff_R14;
  optional<unsigned_long> oVar20;
  vertex_descriptor leftNodeId;
  vertex_descriptor leftNodeId_1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> attemptedItemIds;
  _Storage<unsigned_long,_true> local_88;
  undefined4 local_80;
  undefined4 uStack_7c;
  _Head_base<0UL,_tsbp::Packing2D_*,_false> local_78;
  _Storage<unsigned_long,_true> local_70;
  _Storage<unsigned_long,_true> local_68;
  void *local_60;
  _Head_base<0UL,_tsbp::Packing2D_*,_false> local_58;
  ulong local_50;
  _Storage<unsigned_long,_true> local_48;
  Node *local_40;
  _Storage<unsigned_long,_true> local_38;
  
  psVar12 = (this->tree).super_type.m_vertices.
            super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (*(Status *)((long)&psVar12[nodeId].super_StoredVertex.m_property.super_BaseNode + 8) !=
      InfeasibleSequence) {
    this_00 = &(this->tree).super_type.m_vertices;
    psVar12 = psVar12 + nodeId;
    this_01 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)(psVar12->super_StoredVertex).m_property.Packing._M_t.
                     super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>.
                     _M_t + 0x18);
    psVar15 = *(pointer *)
               ((long)&(psVar12->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
               + 8);
    lVar3 = *(long *)&(psVar12->super_StoredVertex).m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
    ;
    pRVar4 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pRVar5 = (this->items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_48 = (_Storage<unsigned_long,_true>)nodeId;
    local_38 = (_Storage<unsigned_long,_true>)nodeId;
    sVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_01);
    unaff_R14._M_value = ((long)pRVar4 - (long)pRVar5 >> 5) - sVar10;
    if ((int *)((long)psVar15 - lVar3 >> 4) != (int *)unaff_R14._M_value) {
      local_40 = &(psVar12->super_StoredVertex).m_property;
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(this->items).
                       super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl
                       .super__Vector_impl_data._M_start >> 5,0,
                 (allocator<unsigned_long> *)&local_88);
      psVar12 = (this_00->
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar7 = *(pointer *)
                ((long)&psVar12[nodeId].super_StoredVertex.m_out_edges.
                        super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
                + 8);
      for (psVar15 = *(pointer *)
                      &psVar12[nodeId].super_StoredVertex.m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
          ; psVar15 != psVar7; psVar15 = psVar15 + 1) {
        iVar2 = psVar12[(psVar15->super_stored_edge<unsigned_long>).m_target].super_StoredVertex.
                m_property.super_BaseNode.ItemIdToPlace;
        uVar14 = (ulong)iVar2;
        if (-1 < (long)uVar14) {
          if (local_50 <= uVar14) {
            __assert_fail("pos < m_num_bits","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                          0x40b,
                          "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::set(size_type, bool) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                         );
          }
          puVar1 = (ulong *)(local_68._M_value + (uVar14 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        }
      }
      unaff_R14 = (_Storage<unsigned_long,_true>)
                  (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      for (piVar16 = (this->branchingOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar16 != (int *)unaff_R14._M_value;
          piVar16 = piVar16 + 1) {
        iVar2 = *piVar16;
        uVar14 = (ulong)iVar2;
        bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (this_01,uVar14);
        if ((!bVar9) &&
           ((*(ulong *)(local_68._M_value + (uVar14 >> 6) * 8) >> (uVar14 & 0x3f) & 1) == 0)) {
          _Var19._M_value =
               ((long)(this->tree).super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->tree).super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
          local_88._M_value._4_4_ = 0;
          local_80 = 2;
          _Var6._M_t.
          super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
          super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
               (local_40->Packing)._M_t.
               super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t;
          local_88._M_value._0_4_ = iVar2;
          local_70._M_value = _Var19._M_value;
          pPVar11 = (Packing2D *)operator_new(0xa0);
          Packing2D::Packing2D
                    (pPVar11,(Packing2D *)
                             _Var6._M_t.
                             super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                             .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl);
          local_78._M_head_impl = pPVar11;
          AddLeafNode(this,(Node *)&local_88);
          std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr
                    ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)&local_78
                    );
          _Var17 = local_38;
          if (local_38._M_value <= _Var19._M_value) {
            _Var17._M_value = _Var19._M_value;
          }
          psVar12 = (this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((int *)(((long)(this->tree).super_type.m_vertices.
                             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4) *
                     -0x5555555555555555) <= _Var17._M_value) {
            std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::resize(this_00,_Var17._M_value + 1);
            psVar12 = (this_00->
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          local_88._M_value = _Var19._M_value;
          pvVar13 = operator_new(1);
          local_80 = SUB84(pvVar13,0);
          uStack_7c = (undefined4)((ulong)pvVar13 >> 0x20);
          std::
          vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
          ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                    ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                      *)(psVar12 + nodeId),
                     (stored_edge_property<unsigned_long,_boost::no_property> *)&local_88);
          if ((void *)CONCAT44(uStack_7c,local_80) != (void *)0x0) {
            operator_delete((void *)CONCAT44(uStack_7c,local_80),1);
          }
          iVar8._M_current =
               (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            this = (LeftmostActiveOnly *)&this->activeNodes;
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar8,
                       &local_70._M_value);
          }
          else {
            *iVar8._M_current = (unsigned_long)local_70;
            (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          uVar14 = CONCAT71((int7)((ulong)this >> 8),1);
          unaff_R14 = local_70;
          goto LAB_001207ed;
        }
      }
      uVar14 = 0;
LAB_001207ed:
      bVar9 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_68);
      if (!bVar9) {
        __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                      0x2be,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if ((void *)local_68._M_value != (void *)0x0) {
        operator_delete((void *)local_68,(long)local_58._M_head_impl - (long)local_68);
      }
      goto LAB_001203f9;
    }
    std::
    _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<unsigned_long&>
              ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->nodesToDeactivate,&local_48);
    if (*(Status *)((long)&(psVar12->super_StoredVertex).m_property.super_BaseNode + 8) != Root) {
      _Var6._M_t.super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>.
      super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl =
           (psVar12->super_StoredVertex).m_property.Packing._M_t.
           super___uniq_ptr_impl<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>._M_t;
      if ((*(int *)((long)_Var6._M_t.
                          super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                          .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 4) != 0)
         || (*(int *)_Var6._M_t.
                     super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                     .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl !=
             *(int *)((long)_Var6._M_t.
                            super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                            .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl + 0x10)))
      {
        _Var18._M_value =
             ((long)(this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->tree).super_type.m_vertices.
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        local_68._M_value = 0x1ffffffff;
        local_60 = (void *)CONCAT44(local_60._4_4_,2);
        local_88._M_value = _Var18._M_value;
        pPVar11 = (Packing2D *)operator_new(0xa0);
        Packing2D::Packing2D
                  (pPVar11,(Packing2D *)
                           _Var6._M_t.
                           super__Tuple_impl<0UL,_tsbp::Packing2D_*,_std::default_delete<tsbp::Packing2D>_>
                           .super__Head_base<0UL,_tsbp::Packing2D_*,_false>._M_head_impl);
        local_58._M_head_impl = pPVar11;
        AddLeafNode(this,(Node *)&local_68);
        std::unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_>::~unique_ptr
                  ((unique_ptr<tsbp::Packing2D,_std::default_delete<tsbp::Packing2D>_> *)&local_58);
        _Var17 = local_48;
        _Var19._M_value = _Var18._M_value;
        if (_Var18._M_value < local_48._M_value) {
          _Var19 = local_48;
        }
        psVar12 = (this->tree).super_type.m_vertices.
                  super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((int *)(((long)(this->tree).super_type.m_vertices.
                           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar12 >> 4) *
                   -0x5555555555555555) <= _Var19._M_value) {
          std::
          vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ::resize(this_00,_Var19._M_value + 1);
          psVar12 = (this_00->
                    super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        local_68._M_value = _Var18._M_value;
        local_60 = operator_new(1);
        std::
        vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
        ::emplace_back<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>
                  ((vector<boost::detail::stored_edge_property<unsigned_long,boost::no_property>,std::allocator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>>
                    *)(psVar12 + _Var17._M_value),
                   (stored_edge_property<unsigned_long,_boost::no_property> *)&local_68);
        if (local_60 != (void *)0x0) {
          operator_delete(local_60,1);
        }
        iVar8._M_current =
             (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          this = (LeftmostActiveOnly *)&this->activeNodes;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,iVar8,
                     &local_88._M_value);
        }
        else {
          *iVar8._M_current = (unsigned_long)local_88;
          (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        uVar14 = CONCAT71((int7)((ulong)this >> 8),1);
        unaff_R14 = local_88;
        goto LAB_001203f9;
      }
      *(Status *)((long)&(psVar12->super_StoredVertex).m_property.super_BaseNode + 8) =
           InfeasibleSequence;
    }
  }
  uVar14 = 0;
LAB_001203f9:
  oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar14 & 0xffffffff;
  oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_R14._M_value;
  return (optional<unsigned_long>)
         oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> LeftmostActiveOnly::Branch(size_t nodeId)
{
    Node& currentNode = this->tree[nodeId];
    const boost::dynamic_bitset<>& placedItems = currentNode.PlacedItems();

    if (currentNode.NodeStatus == BaseNode::Status::InfeasibleSequence)
    {
        return std::nullopt;
    }

    // Determine number of outgoing edges.
    size_t numberOfOutgoingEdges = boost::out_degree(nodeId, this->tree);
    size_t numberOfRemainingItems = items.size() - placedItems.count();

    ////bool isFixedSequenceDeactivation = numberOfOutgoingEdges == 1 && IsFixedSequence(currentNode, -1);
    ////if (numberOfOutgoingEdges == numberOfRemainingItems || isFixedSequenceDeactivation)
    if (numberOfOutgoingEdges == numberOfRemainingItems)
    {
        // TODO.Logic: currently the DeactivatePlacement node is the last node that is generated. Rework to allow it to be explored in any sequence.

        this->nodesToDeactivate.emplace(nodeId);

        const Packing2D& packing = *currentNode.Packing;

        int placementX = packing.ActiveX;
        int placementY = packing.ActiveY;

        if (currentNode.NodeStatus == Node::Status::Root)
        {
            return std::nullopt;
        }

        if (placementY == 0 && placementX == packing.MaxX)
        {
            currentNode.NodeStatus = BaseNode::Status::InfeasibleSequence;
            return std::nullopt;
        }

        /*
        typename SearchTree::in_edge_iterator inEdgeIterator;
        typename SearchTree::in_edge_iterator inEdgeEndIterator;
        typename SearchTree::edge_descriptor inEdge;

        for (boost::tie(inEdgeIterator, inEdgeEndIterator) = boost::in_edges(this->tree, nodeId); inEdgeIterator != inEdgeEndIterator; ++inEdgeIterator)
        {
            inEdge = *inEdgeIterator;
            typename SearchTree::vertex_descriptor targetId = boost::source(inEdge, this->tree);
            const Node& targetNode = this->tree[targetId];
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{-1, BaseNode::Type::DeactivatePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().
        // TODO.Performance: Consider using std::unique_ptr<Node> to reduce copy effort.

        this->activeNodes.push_back(leftNodeId);

        return leftNodeId;
    }

    typename SearchTree::out_edge_iterator outEdgeIterator;
    typename SearchTree::out_edge_iterator outEdgeEndIterator;
    typename SearchTree::edge_descriptor outEdge;

    boost::dynamic_bitset<> attemptedItemIds(items.size());

    for (boost::tie(outEdgeIterator, outEdgeEndIterator) = boost::out_edges(nodeId, this->tree); outEdgeIterator != outEdgeEndIterator; ++outEdgeIterator)
    {
        outEdge = *outEdgeIterator;
        typename SearchTree::vertex_descriptor targetId = boost::target(outEdge, this->tree);
        const Node& targetNode = this->tree[targetId];

        if (targetNode.ItemIdToPlace >= 0)
        {
            attemptedItemIds.set(targetNode.ItemIdToPlace);
        }
    }

    std::optional<size_t> newNodeId;
    // TODO.Logic: different branching logic, e.g. largest item or deliberately disable placement.
    ////for (size_t i = 0; i < items.size(); i++)
    for (int i: this->branchingOrder)
    {
        ////if (placedItems.contains(i) || attemptedItemIds[i])
        if (placedItems[i] || attemptedItemIds[i])
        {
            continue;
        }

        /*
        if (!IsFixedSequence(currentNode, i))
        {
            continue;
        }
        */

        typename SearchTree::vertex_descriptor leftNodeId = boost::num_vertices(this->tree);
        AddLeafNode(Node{(int)i, BaseNode::Type::UsePlacement, BaseNode::Status::NotEvaluated, std::make_unique<Packing2D>(*currentNode.Packing)});
        boost::add_edge(nodeId, leftNodeId, this->tree);

        // TODO.Safety: Caution, possible dangling reference to currentNode because the underlying graph might resize on AddLeafNode().

        this->activeNodes.push_back(leftNodeId);
        newNodeId = leftNodeId;

        break;
    }

    return newNodeId;
}